

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O3

int Pdr_SetCompare(Pdr_Set_t **pp1,Pdr_Set_t **pp2)

{
  uint uVar1;
  uint uVar2;
  Pdr_Set_t *pPVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  pPVar3 = *pp2;
  uVar1 = (*pp1)->nLits;
  uVar6 = (ulong)(int)uVar1;
  if ((long)uVar6 < 1) {
    uVar5 = 0;
    bVar8 = false;
  }
  else {
    uVar2 = pPVar3->nLits;
    uVar5 = 0;
    if ((int)uVar2 < 1) {
      bVar8 = true;
    }
    else {
      uVar7 = 0;
      do {
        iVar4 = *(int *)(&(*pp1)->field_0x14 + uVar7 * 4);
        if (*(int *)(&pPVar3->field_0x14 + uVar7 * 4) < iVar4) {
          return -1;
        }
        if (iVar4 < *(int *)(&pPVar3->field_0x14 + uVar7 * 4)) {
          return 1;
        }
        if (uVar6 - 1 == uVar7) {
          bVar8 = uVar7 + 1 < uVar6;
          uVar5 = uVar1;
          goto LAB_005fff16;
        }
        uVar7 = uVar7 + 1;
      } while (uVar2 != uVar7);
      bVar8 = uVar7 < uVar6;
      uVar5 = uVar2;
    }
  }
  if (uVar5 == uVar1) {
LAB_005fff16:
    if ((int)uVar1 < pPVar3->nLits) {
      return -1;
    }
  }
  if ((!bVar8) || (iVar4 = 1, uVar5 != pPVar3->nLits)) {
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int Pdr_SetCompare( Pdr_Set_t ** pp1, Pdr_Set_t ** pp2 )
{
    Pdr_Set_t * p1 = *pp1;
    Pdr_Set_t * p2 = *pp2;
    int i;
    for ( i = 0; i < p1->nLits && i < p2->nLits; i++ )
    {
        if ( p1->Lits[i] > p2->Lits[i] )
            return -1;
        if ( p1->Lits[i] < p2->Lits[i] )
            return 1;
    }
    if ( i == p1->nLits && i < p2->nLits )
        return -1;
    if ( i < p1->nLits && i == p2->nLits )
        return 1;
    return 0;
}